

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.cpp
# Opt level: O3

void __thiscall
qclab::qgates::CPhase<std::complex<double>_>::apply
          (CPhase<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  Phase<std::complex<double>_> *pPVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> qubits;
  int *local_60 [2];
  long local_50;
  undefined1 local_48 [16];
  double local_38;
  
  (*(this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])(local_60,this);
  *(ulong *)local_60[0] =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)local_60[0] >> 0x20),
                offset + (int)*(undefined8 *)local_60[0]);
  iVar1 = (this->super_QControlledGate2<std::complex<double>_>).control_;
  iVar3 = (*(this->super_QControlledGate2<std::complex<double>_>).
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xf])(this);
  pPVar2 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<double>_>,_std::default_delete<qclab::qgates::Phase<std::complex<double>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<double>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<double>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<double>_>_*,_false>._M_head_impl
  ;
  local_48._8_8_ = (pPVar2->angle_).cos_;
  local_38 = (pPVar2->angle_).sin_;
  local_48._0_8_ =
       (vector->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  if (op == ConjTrans) {
    local_38 = (double)((ulong)local_38 ^ (ulong)DAT_0011cc60);
  }
  apply4b<qclab::qgates::lambda_Phase<std::complex<double>>(qclab::Op,std::complex<double>&,std::complex<double>*)::_lambda(unsigned_long)_1_>
            (nbQubits,*local_60[0],local_60[0][1],iVar1 + offset,iVar3 + offset,
             (this->super_QControlledGate2<std::complex<double>_>).controlState_,
             (anon_class_24_2_357f297d *)local_48);
  if (local_60[0] != (int *)0x0) {
    operator_delete(local_60[0],local_50 - (long)local_60[0]);
  }
  return;
}

Assistant:

void CPhase< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    T lambda = T( cos() , sin() ) ;
    auto f = lambda_Phase( op , lambda , vector.data() ) ;
    apply4b( nbQubits , qubits[0] , qubits[1] , control , target ,
             this->controlState() , f ) ;
  }